

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateClearFunctionDeclaration
          (OneofGenerator *this,Printer *printer)

{
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  vars;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  CStack_18;
  
  io::Printer::
  WithVars<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>const&,void,void>
            (&CStack_18,printer,&this->variables_);
  io::Printer::Emit(printer,0xbe,
                    "\n      /**\n       * Clears whatever value was set for the oneof \'$name$\'.\n       **/\n      void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);\n    "
                   );
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup(&CStack_18);
  return;
}

Assistant:

void OneofGenerator::GenerateClearFunctionDeclaration(
    io::Printer* printer) const {
  auto vars = printer->WithVars(variables_);
  printer->Emit(R"objc(
      /**
       * Clears whatever value was set for the oneof '$name$'.
       **/
      void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);
    )objc");
}